

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O2

void __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,symbol x,
          ulint i)

{
  reference __x;
  vector<bool,_std::allocator<bool>_> code;
  _Bvector_base<std::allocator<bool>_> local_40;
  
  if (this->n != 0) {
    if (this->unary_string == false) {
      __x = std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::at(&this->codes,(ulong)x);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_40,__x);
      insert(this,(vector<bool,_std::allocator<bool>_> *)&local_40,0,0,i);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_40);
    }
    this->current_size = this->current_size + 1;
  }
  return;
}

Assistant:

void insert(symbol x, ulint i){

		if(n==0)
			return;

	#ifdef DEBUG
		if(i>current_size){

			cout << "ERROR (DynamicString): trying to insert in position outside current string : " << i << ">" << current_size << endl;
			exit(0);

		}

		if(current_freqs.at(x)>=freq.at(x)){

			cout << "ERROR (DynamicString): too many symbols " << (uint)x << " inserted!" << endl;
			exit(0);

		}

		current_freqs.at(x) += 1;

	#endif


		if(not unary_string){

			vector<bool> code = codes.at(x);//bitvector to be inserted in the wavelet tree
			insert(&code,0,0,i);

		}

		current_size++;

	}